

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector_types.cpp
# Opt level: O1

void duckdb::TestVectorSequence::GenerateVector
               (TestVectorInfo *info,LogicalType *type,Vector *result)

{
  LogicalTypeId LVar1;
  pointer puVar2;
  data_ptr_t pdVar3;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *pvVar4;
  pointer pVVar5;
  type result_00;
  LogicalType *type_00;
  Vector *result_01;
  NotImplementedException *this;
  _Rb_tree_header *p_Var6;
  _Base_ptr p_Var7;
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *child_entry;
  pointer this_00;
  _Base_ptr p_Var8;
  bool bVar9;
  LogicalType local_a0;
  Value local_88;
  string local_48;
  
  LVar1 = type->id_;
  if ((LVar1 < 0x20) && ((0xf0007800U >> (LVar1 & 0x1f) & 1) != 0)) {
    Vector::Sequence(result,3,2,3);
    return;
  }
  if (type->physical_type_ == LIST) {
    pdVar3 = result->data;
    pdVar3[0] = '\0';
    pdVar3[1] = '\0';
    pdVar3[2] = '\0';
    pdVar3[3] = '\0';
    pdVar3[4] = '\0';
    pdVar3[5] = '\0';
    pdVar3[6] = '\0';
    pdVar3[7] = '\0';
    pdVar3[8] = '\x02';
    pdVar3[9] = '\0';
    pdVar3[10] = '\0';
    pdVar3[0xb] = '\0';
    pdVar3[0xc] = '\0';
    pdVar3[0xd] = '\0';
    pdVar3[0xe] = '\0';
    pdVar3[0xf] = '\0';
    pdVar3[0x10] = '\x02';
    pdVar3[0x11] = '\0';
    pdVar3[0x12] = '\0';
    pdVar3[0x13] = '\0';
    pdVar3[0x14] = '\0';
    pdVar3[0x15] = '\0';
    pdVar3[0x16] = '\0';
    pdVar3[0x17] = '\0';
    pdVar3[0x18] = '\0';
    pdVar3[0x19] = '\0';
    pdVar3[0x1a] = '\0';
    pdVar3[0x1b] = '\0';
    pdVar3[0x1c] = '\0';
    pdVar3[0x1d] = '\0';
    pdVar3[0x1e] = '\0';
    pdVar3[0x1f] = '\0';
    pdVar3[0x20] = '\x02';
    pdVar3[0x21] = '\0';
    pdVar3[0x22] = '\0';
    pdVar3[0x23] = '\0';
    pdVar3[0x24] = '\0';
    pdVar3[0x25] = '\0';
    pdVar3[0x26] = '\0';
    pdVar3[0x27] = '\0';
    pdVar3[0x28] = '\x01';
    pdVar3[0x29] = '\0';
    pdVar3[0x2a] = '\0';
    pdVar3[0x2b] = '\0';
    pdVar3[0x2c] = '\0';
    pdVar3[0x2d] = '\0';
    pdVar3[0x2e] = '\0';
    pdVar3[0x2f] = '\0';
    type_00 = ListType::GetChildType(type);
    result_01 = ListVector::GetEntry(result);
    GenerateVector(info,type_00,result_01);
    ListVector::SetListSize(result,3);
    return;
  }
  if (type->physical_type_ == STRUCT) {
    pvVar4 = StructVector::GetEntries(result);
    puVar2 = (pvVar4->
             super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
             ).
             super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this_00 = (pvVar4->
                   super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                   ).
                   super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_00 != puVar2;
        this_00 = this_00 + 1) {
      pVVar5 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator->
                         (this_00);
      result_00 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                            (this_00);
      GenerateVector(info,&pVVar5->type,result_00);
    }
  }
  else {
    p_Var6 = &(info->test_type_map->_M_t)._M_impl.super__Rb_tree_header;
    p_Var8 = (info->test_type_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var7 = &p_Var6->_M_header;
    for (; p_Var8 != (_Base_ptr)0x0; p_Var8 = (&p_Var8->_M_left)[bVar9]) {
      bVar9 = (LogicalTypeId)p_Var8[1]._M_color < LVar1;
      if (!bVar9) {
        p_Var7 = p_Var8;
      }
    }
    p_Var8 = &p_Var6->_M_header;
    if (((_Rb_tree_header *)p_Var7 != p_Var6) &&
       (p_Var8 = p_Var7, LVar1 < (LogicalTypeId)p_Var7[1]._M_color)) {
      p_Var8 = &p_Var6->_M_header;
    }
    if ((_Rb_tree_header *)p_Var8 == p_Var6) {
      this = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_88.type_._0_8_ = (long)&local_88 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"Unimplemented type for test_vector_types %s","");
      LogicalType::ToString_abi_cxx11_(&local_48,type);
      NotImplementedException::NotImplementedException<std::__cxx11::string>
                (this,(string *)&local_88,&local_48);
      __cxa_throw(this,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    Vector::SetValue(result,0,(Value *)(p_Var8 + 3));
    Vector::SetValue(result,1,(Value *)(p_Var8 + 5));
    LogicalType::LogicalType(&local_a0,type);
    Value::Value(&local_88,&local_a0);
    Vector::SetValue(result,2,&local_88);
    Value::~Value(&local_88);
    LogicalType::~LogicalType(&local_a0);
  }
  return;
}

Assistant:

static void GenerateVector(TestVectorInfo &info, const LogicalType &type, Vector &result) {
		D_ASSERT(type == result.GetType());
		switch (type.id()) {
		case LogicalTypeId::TINYINT:
		case LogicalTypeId::SMALLINT:
		case LogicalTypeId::INTEGER:
		case LogicalTypeId::BIGINT:
		case LogicalTypeId::UTINYINT:
		case LogicalTypeId::USMALLINT:
		case LogicalTypeId::UINTEGER:
		case LogicalTypeId::UBIGINT:
			result.Sequence(3, 2, 3);
#if STANDARD_VECTOR_SIZE <= 2
			result.Flatten(3);
#endif
			return;
		default:
			break;
		}
		switch (type.InternalType()) {
		case PhysicalType::STRUCT: {
			auto &child_entries = StructVector::GetEntries(result);
			for (auto &child_entry : child_entries) {
				GenerateVector(info, child_entry->GetType(), *child_entry);
			}
			break;
		}
		case PhysicalType::LIST: {
			D_ASSERT(type.id() != LogicalTypeId::MAP);
			auto data = FlatVector::GetData<list_entry_t>(result);
			data[0].offset = 0;
			data[0].length = 2;
			data[1].offset = 2;
			data[1].length = 0;
			data[2].offset = 2;
			data[2].length = 1;

			GenerateVector(info, ListType::GetChildType(type), ListVector::GetEntry(result));
			ListVector::SetListSize(result, 3);
			break;
		}
		default: {
			auto entry = info.test_type_map.find(type.id());
			if (entry == info.test_type_map.end()) {
				throw NotImplementedException("Unimplemented type for test_vector_types %s", type.ToString());
			}
			result.SetValue(0, entry->second.min_value);
			result.SetValue(1, entry->second.max_value);
			result.SetValue(2, Value(type));
			break;
		}
		}
	}